

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Card.cpp
# Opt level: O3

bool __thiscall Card::isBigger(Card *this,Card *rhs,Contract *c)

{
  Type TVar1;
  Type TVar2;
  bool bVar3;
  
  TVar1 = this->_color;
  if (rhs->_color == TVar1) {
    bVar3 = (int)rhs->_value < (int)this->_value;
  }
  else {
    TVar2 = Contract::getColor(c);
    if (TVar1 == TVar2) {
      TVar1 = rhs->_color;
      TVar2 = Contract::getColor(c);
      bVar3 = TVar1 != TVar2;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool Card::isBigger(Card *rhs, Contract *c) {
    if (rhs->getColor() == getColor()) {
        return getValue() > rhs->getValue();
    }
    return getColor() == c->getColor() && rhs->getColor() != c->getColor();
}